

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void denseMatvec(realtype **a,realtype *x,realtype *y,sunindextype m,sunindextype n)

{
  sunindextype in_ECX;
  realtype *in_RDX;
  realtype *in_RSI;
  realtype **in_RDI;
  sunindextype in_R8D;
  
  SUNDlsMat_denseMatvec(in_RDI,in_RSI,in_RDX,in_ECX,in_R8D);
  return;
}

Assistant:

void denseMatvec(realtype **a, realtype *x, realtype *y, sunindextype m, sunindextype n)
{
  SUNDlsMat_denseMatvec(a, x, y, m, n);
}